

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.hpp
# Opt level: O0

SPIRExpression * __thiscall
spirv_cross::Compiler::set<spirv_cross::SPIRExpression,std::__cxx11::string,unsigned_int&,bool>
          (Compiler *this,uint32_t id,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,uint *args_1,
          bool *args_2)

{
  Variant *var_00;
  TypedID<(spirv_cross::Types)0> local_44;
  SPIRExpression *local_40;
  SPIRExpression *var;
  bool *local_30;
  bool *args_local_2;
  uint *args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  Compiler *pCStack_10;
  uint32_t id_local;
  Compiler *this_local;
  
  local_30 = args_2;
  args_local_2 = (bool *)args_1;
  args_local_1 = (uint *)args;
  args_local._4_4_ = id;
  pCStack_10 = this;
  TypedID<(spirv_cross::Types)0>::TypedID((TypedID<(spirv_cross::Types)0> *)((long)&var + 4),id);
  ParsedIR::add_typed_id(&this->ir,TypeExpression,var._4_4_);
  var_00 = VectorView<spirv_cross::Variant>::operator[]
                     (&(this->ir).ids.super_VectorView<spirv_cross::Variant>,(ulong)args_local._4_4_
                     );
  local_40 = variant_set<spirv_cross::SPIRExpression,std::__cxx11::string,unsigned_int&,bool>
                       (var_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               args_local_1,(uint *)args_local_2,local_30);
  TypedID<(spirv_cross::Types)0>::TypedID(&local_44,args_local._4_4_);
  (local_40->super_IVariant).self.id = local_44.id;
  set_initializers(this,local_40);
  return local_40;
}

Assistant:

T &set(uint32_t id, P &&... args)
	{
		ir.add_typed_id(static_cast<Types>(T::type), id);
		auto &var = variant_set<T>(ir.ids[id], std::forward<P>(args)...);
		var.self = id;
		set_initializers(var);
		return var;
	}